

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O2

void __thiscall txpackage_tests::package_hash_tests::test_method(package_hash_tests *this)

{
  long lVar1;
  _Cat _Var2;
  bool bVar3;
  readonly_property65 rVar4;
  long lVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  Wtxid *pWVar7;
  iterator pvVar8;
  Txid *pTVar9;
  uint256 *puVar10;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  Span<const_std::byte> sp;
  Span<const_std::byte> sp_00;
  Span<const_std::byte> sp_01;
  string_view hex;
  string_view hex_00;
  string_view hex_01;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  string_view hex_02;
  string_view hex_03;
  string_view hex_04;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_01;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_02;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_03;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_04;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  Wtxid *pWVar11;
  assertion_result *ar;
  char *local_9c8;
  char *local_9c0;
  undefined1 *local_9b8;
  undefined1 *local_9b0;
  char *local_9a8;
  char *local_9a0;
  char *local_998;
  char *local_990;
  undefined1 *local_988;
  undefined1 *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  undefined1 *local_958;
  undefined1 *local_950;
  char *local_948;
  char *local_940;
  char *local_938;
  char *local_930;
  undefined1 *local_928;
  undefined1 *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  undefined1 *local_8f8;
  undefined1 *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  undefined1 *local_8c8;
  undefined1 *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  undefined1 *local_888;
  undefined1 *local_880;
  char *local_878;
  char *local_870;
  char *local_868;
  char *local_860;
  undefined1 *local_858;
  undefined1 *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  undefined1 *local_828;
  undefined1 *local_820;
  char *local_818;
  char *local_810;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  package_321;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  package_312;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  package_213;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  package_231;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  package_132;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  package_123;
  char *local_778;
  char *local_770;
  undefined1 *local_768;
  undefined1 *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  undefined1 *local_738;
  undefined1 *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  undefined1 *local_708;
  undefined1 *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  undefined1 *local_6d8;
  undefined1 *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  undefined1 *local_6a8;
  undefined1 *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  undefined1 *local_648;
  undefined1 *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  undefined1 *local_618;
  undefined1 *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  CTransactionRef ptx_3;
  DataStream stream_3;
  CTransactionRef ptx_2;
  DataStream stream_2;
  CTransactionRef ptx_1;
  DataStream stream_1;
  undefined1 local_448 [8];
  element_type *local_440;
  shared_count asStack_438 [2];
  uint256 hash_if_use_int_order;
  uint256 hash_if_use_txid;
  undefined1 local_3e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_3c8;
  uchar local_3b8 [64];
  uint256 hash_if_by_txid;
  uint256 calculated_hash_123;
  Txid txid_3;
  Txid txid_2;
  Txid txid_1;
  Wtxid wtxid_3;
  Wtxid wtxid_2;
  Wtxid wtxid_1;
  CTransaction tx_3;
  CTransaction tx_2;
  CTransaction tx_1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&tx_3,
         _ZTAXtlN4util12hex_literals6detail3HexILm447EEEtlSt5arrayISt4byteLm223EEtlA223_S5_LS5_2ELS5_0ELS5_0ELS5_0ELS5_0ELS5_1ELS5_1ELS5_150ELS5_75ELS5_138ELS5_166ELS5_53ELS5_9ELS5_87ELS5_156ELS5_166ELS5_8ELS5_110ELS5_96ELS5_18ELS5_238ELS5_170ELS5_76ELS5_47ELS5_77ELS5_209ELS5_226ELS5_131ELS5_218ELS5_41ELS5_182ELS5_124ELS5_142ELS5_234ELS5_56ELS5_179ELS5_198ELS5_253ELS5_34ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_253ELS5_255ELS5_255ELS5_255ELS5_2ELS5_148ELS5_198ELS5_24ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_23ELS5_169ELS5_20ELS5_90ELS5_251ELS5_187ELS5_66ELS5_244ELS5_232ELS5_51ELS5_18ELS5_102ELS5_109ELS5_6ELS5_151ELS5_249ELS5_230ELS5_98ELS5_89ELS5_145ELS5_46ELS5_205ELS5_227ELS5_135ELS5_104ELS5_250ELS5_44ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_22ELS5_0ELS5_20ELS5_137ELS5_115ELS5_136ELS5_160ELS5_136ELS5_147ELS5_144ELS5_253ELS5_14ELS5_21ELS5_58ELS5_34ELS5_187ELS5_44ELS5_249ELS5_216ELS5_240ELS5_25ELS5_250ELS5_245ELS5_2ELS5_71ELS5_48ELS5_68ELS5_2ELS5_32ELS5_5ELS5_71ELS5_64ELS5_99ELS5_128ELS5_113ELS5_159ELS5_132ELS5_214ELS5_140ELS5_244ELS5_233ELS5_108ELS5_195ELS5_228ELS5_161ELS5_104ELS5_131ELS5_9ELS5_239ELS5_71ELS5_91ELS5_21ELS5_11ELS5_226ELS5_180ELS5_113ELS5_199ELS5_14ELS5_165ELS5_98ELS5_170ELS5_2ELS5_32ELS5_109ELS5_37ELS5_95ELS5_90ELS5_204ELS5_64ELS5_253ELS5_149ELS5_152ELS5_24ELS5_116ELS5_215ELS5_114ELS5_1ELS5_210ELS5_235ELS5_7ELS5_136ELS5_54ELS5_87ELS5_206ELS5_28ELS5_121ELS5_101ELS5_19ELS5_243ELS5_43ELS5_96ELS5_121ELS5_84ELS5_92ELS5_223ELS5_1ELS5_33ELS5_2ELS5_58ELS5_231ELS5_115ELS5_53ELS5_206ELS5_252ELS5_181ELS5_171ELS5_76ELS5_29ELS5_193ELS5_251ELS5_13ELS5_42ELS5_207ELS5_236ELS5_225ELS5_132ELS5_229ELS5_147ELS5_114ELS5_125ELS5_125ELS5_89ELS5_6ELS5_199ELS5_142ELS5_86ELS5_76ELS5_124ELS5_17ELS5_209ELS5_37ELS5_207ELS5_12EEEEE
         ,0xdf);
  sp.m_size = 0xdf;
  sp.m_data = (byte *)&tx_3;
  DataStream::DataStream(&stream_1,sp);
  CTransaction::CTransaction<DataStream>(&tx_1,&::TX_WITH_WITNESS,&stream_1);
  std::make_shared<CTransaction_const,CTransaction&>((CTransaction *)&ptx_1);
  memcpy(&tx_3,
         _ZTAXtlN4util12hex_literals6detail3HexILm517EEEtlSt5arrayISt4byteLm258EEtlA258_S5_LS5_1ELS5_0ELS5_0ELS5_0ELS5_1ELS5_11ELS5_38ELS5_233ELS5_183ELS5_115ELS5_94ELS5_182ELS5_170ELS5_189ELS5_243ELS5_88ELS5_186ELS5_182ELS5_47ELS5_152ELS5_22ELS5_162ELS5_27ELS5_169ELS5_235ELS5_219ELS5_113ELS5_157ELS5_82ELS5_153ELS5_232ELS5_134ELS5_7ELS5_215ELS5_34ELS5_193ELS5_144ELS5_0ELS5_0ELS5_0ELS5_0ELS5_139ELS5_72ELS5_48ELS5_69ELS5_2ELS5_32ELS5_7ELS5_10ELS5_202ELS5_68ELS5_80ELS5_108ELS5_92ELS5_239ELS5_58ELS5_22ELS5_237ELS5_81ELS5_157ELS5_124ELS5_60ELS5_57ELS5_248ELS5_170ELS5_177ELS5_146ELS5_196ELS5_225ELS5_201ELS5_13ELS5_6ELS5_95ELS5_55ELS5_184ELS5_164ELS5_175ELS5_97ELS5_65ELS5_2ELS5_33ELS5_0ELS5_168ELS5_225ELS5_96ELS5_184ELS5_86ELS5_194ELS5_212ELS5_61ELS5_39ELS5_216ELS5_251ELS5_167ELS5_30ELS5_90ELS5_239ELS5_100ELS5_5ELS5_184ELS5_100ELS5_58ELS5_196ELS5_203ELS5_124ELS5_179ELS5_196ELS5_98ELS5_172ELS5_237ELS5_127ELS5_20ELS5_113ELS5_26ELS5_1ELS5_65ELS5_4ELS5_109ELS5_17ELS5_254ELS5_229ELS5_27ELS5_14ELS5_96ELS5_102ELS5_109ELS5_80ELS5_73ELS5_169ELS5_16ELS5_26ELS5_114ELS5_116ELS5_29ELS5_244ELS5_128ELS5_185ELS5_110ELS5_226ELS5_100ELS5_136ELS5_164ELS5_211ELS5_70ELS5_107ELS5_149ELS5_201ELS5_164ELS5_10ELS5_197ELS5_238ELS5_239ELS5_135ELS5_225ELS5_10ELS5_92ELS5_211ELS5_54ELS5_193ELS5_154ELS5_132ELS5_86ELS5_95ELS5_128ELS5_250ELS5_108ELS5_84ELS5_121ELS5_87ELS5_183ELS5_112ELS5_15ELS5_244ELS5_223ELS5_189ELS5_239ELS5_231ELS5_96ELS5_54ELS5_195ELS5_57ELS5_255ELS5_255ELS5_255ELS5_255ELS5_2ELS5_27ELS5_255ELS5_61ELS5_17ELS5_0ELS5_0ELS5_0ELS5_0ELS5_25ELS5_118ELS5_169ELS5_20ELS5_4ELS5_148ELS5_63ELS5_221ELS5_80ELS5_128ELS5_83ELS5_199ELS5_80ELS5_0ELS5_16ELS5_109ELS5_59ELS5_198ELS5_226ELS5_117ELS5_77ELS5_188ELS5_255ELS5_25ELS5_136ELS5_172ELS5_47ELS5_21ELS5_222ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_25ELS5_118ELS5_169ELS5_20ELS5_162ELS5_102ELS5_67ELS5_109ELS5_41ELS5_101ELS5_84ELS5_118ELS5_8ELS5_185ELS5_225ELS5_93ELS5_144ELS5_50ELS5_167ELS5_185ELS5_214ELS5_79ELS5_164ELS5_49ELS5_136ELS5_172EEEEE
         ,0x102);
  sp_00.m_size = 0x102;
  sp_00.m_data = (byte *)&tx_3;
  DataStream::DataStream(&stream_2,sp_00);
  CTransaction::CTransaction<DataStream>(&tx_2,&::TX_WITH_WITNESS,&stream_2);
  std::make_shared<CTransaction_const,CTransaction&>((CTransaction *)&ptx_2);
  memcpy(&tx_3,&DAT_00c64940,0x140);
  sp_01.m_size = 0x140;
  sp_01.m_data = (byte *)&tx_3;
  DataStream::DataStream(&stream_3,sp_01);
  CTransaction::CTransaction<DataStream>(&tx_3,&::TX_WITH_WITNESS,&stream_3);
  std::make_shared<CTransaction_const,CTransaction&>((CTransaction *)&ptx_3);
  hex._M_str = "85cd1a31eb38f74ed5742ec9cb546712ab5aaf747de28a9168b53e846cbda17f";
  hex._M_len = 0x40;
  transaction_identifier<true>::FromHex((optional<transaction_identifier<true>_> *)local_3e8,hex);
  if (local_3c8._M_ptr._0_1_ == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_3d8._M_local_buf[0];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_3d8._M_local_buf[1];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_3d8._M_local_buf[2];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_3d8._M_local_buf[3];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_3d8._M_local_buf[4];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_3d8._M_local_buf[5];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_3d8._M_local_buf[6];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_3d8._M_local_buf[7];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = local_3d8._M_local_buf[8];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = local_3d8._M_local_buf[9];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = local_3d8._M_local_buf[10];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = local_3d8._M_local_buf[0xb];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = local_3d8._M_local_buf[0xc];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = local_3d8._M_local_buf[0xd];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = local_3d8._M_local_buf[0xe];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = local_3d8._M_local_buf[0xf];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_3e8[0];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_3e8[1];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_3e8[2];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_3e8[3];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_3e8[4];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_3e8[5];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_3e8[6];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_3e8[7];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_3e8[8];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_3e8[9];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_3e8[10];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_3e8[0xb];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_3e8[0xc];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_3e8[0xd];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_3e8[0xe];
    wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_3e8[0xf];
    hex_00._M_str = "b4749f017444b051c44dfd2720e88f314ff94f3dd6d56d40ef65854fcd7fff6b";
    hex_00._M_len = 0x40;
    transaction_identifier<true>::FromHex
              ((optional<transaction_identifier<true>_> *)local_3e8,hex_00);
    if (local_3c8._M_ptr._0_1_ == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_3d8._M_local_buf[0];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_3d8._M_local_buf[1];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_3d8._M_local_buf[2];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_3d8._M_local_buf[3];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_3d8._M_local_buf[4];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_3d8._M_local_buf[5];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_3d8._M_local_buf[6];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_3d8._M_local_buf[7];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = local_3d8._M_local_buf[8];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = local_3d8._M_local_buf[9];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = local_3d8._M_local_buf[10];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = local_3d8._M_local_buf[0xb];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = local_3d8._M_local_buf[0xc];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = local_3d8._M_local_buf[0xd];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = local_3d8._M_local_buf[0xe];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = local_3d8._M_local_buf[0xf];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_3e8[0];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_3e8[1];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_3e8[2];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_3e8[3];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_3e8[4];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_3e8[5];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_3e8[6];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_3e8[7];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_3e8[8];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_3e8[9];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_3e8[10];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_3e8[0xb];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_3e8[0xc];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_3e8[0xd];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_3e8[0xe];
      wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_3e8[0xf];
      hex_01._M_str = "e065bac15f62bb4e761d761db928ddee65a47296b2b776785abb912cdec474e3";
      hex_01._M_len = 0x40;
      transaction_identifier<true>::FromHex
                ((optional<transaction_identifier<true>_> *)local_3e8,hex_01);
      if (local_3c8._M_ptr._0_1_ == false) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_3d8._M_local_buf[0];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_3d8._M_local_buf[1];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_3d8._M_local_buf[2];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_3d8._M_local_buf[3];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_3d8._M_local_buf[4];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_3d8._M_local_buf[5];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_3d8._M_local_buf[6];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_3d8._M_local_buf[7];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = local_3d8._M_local_buf[8];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = local_3d8._M_local_buf[9];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = local_3d8._M_local_buf[10];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = local_3d8._M_local_buf[0xb];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = local_3d8._M_local_buf[0xc];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = local_3d8._M_local_buf[0xd];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = local_3d8._M_local_buf[0xe];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = local_3d8._M_local_buf[0xf];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_3e8[0];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_3e8[1];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_3e8[2];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_3e8[3];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_3e8[4];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_3e8[5];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_3e8[6];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_3e8[7];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_3e8[8];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_3e8[9];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_3e8[10];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_3e8[0xb];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_3e8[0xc];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_3e8[0xd];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_3e8[0xe];
        wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_3e8[0xf];
        local_4e8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
        ;
        local_4e0 = "";
        local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
        msg.m_end = in_R9;
        msg.m_begin = in_R8;
        file.m_end = (iterator)0x4f;
        file.m_begin = (iterator)&local_4e8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_4f8,
                   msg);
        local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffffffffff00;
        local_3e8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_3d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_3d8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_508 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
        ;
        local_500 = "";
        pWVar7 = &tx_1.m_witness_hash;
        pvVar6 = (iterator)0x2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<true>,transaction_identifier<true>>
                  (local_3e8,&local_508,0x4f,1,2,pWVar7,"tx_1.GetWitnessHash()",&wtxid_1,"wtxid_1");
        local_518 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
        ;
        local_510 = "";
        local_528 = &boost::unit_test::basic_cstring<char_const>::null;
        local_520 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_00.m_end = (iterator)pWVar7;
        msg_00.m_begin = pvVar6;
        file_00.m_end = &DAT_00000050;
        file_00.m_begin = (iterator)&local_518;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_528
                   ,msg_00);
        local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffffffffff00;
        local_3e8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_3d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_3d8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_538 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
        ;
        local_530 = "";
        pWVar7 = &tx_2.m_witness_hash;
        pvVar6 = (iterator)0x2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<true>,transaction_identifier<true>>
                  (local_3e8,&local_538,0x50,1,2,pWVar7,"tx_2.GetWitnessHash()",&wtxid_2,"wtxid_2");
        local_548 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
        ;
        local_540 = "";
        local_558 = &boost::unit_test::basic_cstring<char_const>::null;
        local_550 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_01.m_end = (iterator)pWVar7;
        msg_01.m_begin = pvVar6;
        file_01.m_end = (iterator)0x51;
        file_01.m_begin = (iterator)&local_548;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_558
                   ,msg_01);
        local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffffffffff00;
        local_3e8._0_8_ = &PTR__lazy_ostream_01139f30;
        local_3d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_3d8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_568 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
        ;
        local_560 = "";
        pWVar7 = &tx_3.m_witness_hash;
        pWVar11 = &wtxid_3;
        pvVar6 = (iterator)0x2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<true>,transaction_identifier<true>>
                  (local_3e8,&local_568,0x51,1,2,pWVar7,"tx_3.GetWitnessHash()",pWVar11,"wtxid_3");
        local_578 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
        ;
        local_570 = "";
        local_588 = &boost::unit_test::basic_cstring<char_const>::null;
        local_580 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_02.m_end = (iterator)pWVar7;
        msg_02.m_begin = pvVar6;
        file_02.m_end = (iterator)0x53;
        file_02.m_begin = (iterator)&local_578;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_588
                   ,msg_02);
        base_blob<256u>::GetHex_abi_cxx11_((string *)local_3e8,(base_blob<256u> *)&wtxid_1);
        base_blob<256u>::GetHex_abi_cxx11_((string *)&txid_1,(base_blob<256u> *)&wtxid_2);
        _Var2 = std::operator<=><char,std::char_traits<char>,std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_3e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &txid_1);
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        calculated_hash_123.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_124cf42;
        calculated_hash_123.super_base_blob<256U>.m_data._M_elems._8_8_ =
             (long)"wtxid_1.GetHex() < wtxid_2.GetHex()" + 0x23;
        txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
             txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
        txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
        txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
             boost::unit_test::lazy_ostream::inst;
        local_598 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
        ;
        local_590 = "";
        pvVar6 = &DAT_00000001;
        pvVar8 = (iterator)0x0;
        txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &calculated_hash_123;
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = (byte)_Var2._M_value >> 7;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&txid_3,(lazy_ostream *)&txid_2,1,0,WARN,(check_type)pWVar11,
                   (size_t)&local_598,0x53);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)(txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10));
        std::__cxx11::string::~string((string *)&txid_1);
        std::__cxx11::string::~string((string *)local_3e8);
        local_5a8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
        ;
        local_5a0 = "";
        local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_03.m_end = pvVar8;
        msg_03.m_begin = pvVar6;
        file_03.m_end = (iterator)0x54;
        file_03.m_begin = (iterator)&local_5a8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_5b8
                   ,msg_03);
        base_blob<256u>::GetHex_abi_cxx11_((string *)local_3e8,(base_blob<256u> *)&wtxid_2);
        base_blob<256u>::GetHex_abi_cxx11_((string *)&txid_1,(base_blob<256u> *)&wtxid_3);
        _Var2 = std::operator<=><char,std::char_traits<char>,std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_3e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &txid_1);
        ar = (assertion_result *)&txid_3;
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = (byte)_Var2._M_value >> 7;
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        calculated_hash_123.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_124cf5b;
        calculated_hash_123.super_base_blob<256U>.m_data._M_elems._8_8_ =
             (long)"wtxid_2.GetHex() < wtxid_3.GetHex()" + 0x23;
        txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
             txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
        txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
        txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
             boost::unit_test::lazy_ostream::inst;
        local_5c8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
        ;
        local_5c0 = "";
        pvVar6 = &DAT_00000001;
        pvVar8 = (iterator)0x0;
        txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &calculated_hash_123;
        boost::test_tools::tt_detail::report_assertion
                  (ar,(lazy_ostream *)&txid_2,1,0,WARN,(check_type)pWVar11,(size_t)&local_5c8,0x54);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)(txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10));
        std::__cxx11::string::~string((string *)&txid_1);
        std::__cxx11::string::~string((string *)local_3e8);
        hex_02._M_str = "bd0f71c1d5e50589063e134fad22053cdae5ab2320db5bf5e540198b0b5a4e69";
        hex_02._M_len = 0x40;
        transaction_identifier<false>::FromHex
                  ((optional<transaction_identifier<false>_> *)local_3e8,hex_02);
        if (local_3c8._M_ptr._0_1_ == false) {
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            std::__throw_bad_optional_access();
          }
        }
        else {
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_3d8._M_local_buf[0];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_3d8._M_local_buf[1];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_3d8._M_local_buf[2];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_3d8._M_local_buf[3];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_3d8._M_local_buf[4];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_3d8._M_local_buf[5];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_3d8._M_local_buf[6];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_3d8._M_local_buf[7];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = local_3d8._M_local_buf[8];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = local_3d8._M_local_buf[9];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = local_3d8._M_local_buf[10];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = local_3d8._M_local_buf[0xb]
          ;
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = local_3d8._M_local_buf[0xc]
          ;
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = local_3d8._M_local_buf[0xd]
          ;
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = local_3d8._M_local_buf[0xe]
          ;
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = local_3d8._M_local_buf[0xf]
          ;
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_3e8[0];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_3e8[1];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_3e8[2];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_3e8[3];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_3e8[4];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_3e8[5];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_3e8[6];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_3e8[7];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_3e8[8];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_3e8[9];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_3e8[10];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_3e8[0xb];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_3e8[0xc];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_3e8[0xd];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_3e8[0xe];
          txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_3e8[0xf];
          hex_03._M_str = "b4749f017444b051c44dfd2720e88f314ff94f3dd6d56d40ef65854fcd7fff6b";
          hex_03._M_len = 0x40;
          transaction_identifier<false>::FromHex
                    ((optional<transaction_identifier<false>_> *)local_3e8,hex_03);
          if (local_3c8._M_ptr._0_1_ == false) {
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              std::__throw_bad_optional_access();
            }
          }
          else {
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_3d8._M_local_buf[0]
            ;
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_3d8._M_local_buf[1]
            ;
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_3d8._M_local_buf[2]
            ;
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_3d8._M_local_buf[3]
            ;
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_3d8._M_local_buf[4]
            ;
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_3d8._M_local_buf[5]
            ;
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_3d8._M_local_buf[6]
            ;
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_3d8._M_local_buf[7]
            ;
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = local_3d8._M_local_buf[8]
            ;
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = local_3d8._M_local_buf[9]
            ;
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
                 local_3d8._M_local_buf[10];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
                 local_3d8._M_local_buf[0xb];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
                 local_3d8._M_local_buf[0xc];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
                 local_3d8._M_local_buf[0xd];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
                 local_3d8._M_local_buf[0xe];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
                 local_3d8._M_local_buf[0xf];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_3e8[0];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_3e8[1];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_3e8[2];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_3e8[3];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_3e8[4];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_3e8[5];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_3e8[6];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_3e8[7];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_3e8[8];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_3e8[9];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_3e8[10];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_3e8[0xb];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_3e8[0xc];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_3e8[0xd];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_3e8[0xe];
            txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_3e8[0xf];
            hex_04._M_str = "ee707be5201160e32c4fc715bec227d1aeea5940fb4295605e7373edce3b1a93";
            hex_04._M_len = 0x40;
            transaction_identifier<false>::FromHex
                      ((optional<transaction_identifier<false>_> *)local_3e8,hex_04);
            if (local_3c8._M_ptr._0_1_ == false) {
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                std::__throw_bad_optional_access();
              }
            }
            else {
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
                   local_3d8._M_local_buf[0];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
                   local_3d8._M_local_buf[1];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
                   local_3d8._M_local_buf[2];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
                   local_3d8._M_local_buf[3];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
                   local_3d8._M_local_buf[4];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
                   local_3d8._M_local_buf[5];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
                   local_3d8._M_local_buf[6];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
                   local_3d8._M_local_buf[7];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
                   local_3d8._M_local_buf[8];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
                   local_3d8._M_local_buf[9];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
                   local_3d8._M_local_buf[10];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
                   local_3d8._M_local_buf[0xb];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
                   local_3d8._M_local_buf[0xc];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
                   local_3d8._M_local_buf[0xd];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
                   local_3d8._M_local_buf[0xe];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
                   local_3d8._M_local_buf[0xf];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_3e8[0];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_3e8[1];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_3e8[2];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_3e8[3];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_3e8[4];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_3e8[5];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_3e8[6];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_3e8[7];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_3e8[8];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_3e8[9];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_3e8[10];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_3e8[0xb];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_3e8[0xc];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_3e8[0xd];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_3e8[0xe];
              txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_3e8[0xf];
              local_5d8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_5d0 = "";
              local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_04.m_end = pvVar8;
              msg_04.m_begin = pvVar6;
              file_04.m_end = (iterator)0x5a;
              file_04.m_begin = (iterator)&local_5d8;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
                         (size_t)&local_5e8,msg_04);
              local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffffffffff00;
              local_3e8._0_8_ = &PTR__lazy_ostream_01139f30;
              local_3d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_3d8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
              local_5f8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_5f0 = "";
              pTVar9 = &tx_1.hash;
              pvVar6 = (iterator)0x2;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<false>,transaction_identifier<false>>
                        (local_3e8,&local_5f8,0x5a,1,2,pTVar9,"tx_1.GetHash()",(string *)&txid_1,
                         "txid_1");
              local_608 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_600 = "";
              local_618 = &boost::unit_test::basic_cstring<char_const>::null;
              local_610 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_05.m_end = (iterator)pTVar9;
              msg_05.m_begin = pvVar6;
              file_05.m_end = (iterator)0x5b;
              file_05.m_begin = (iterator)&local_608;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                         (size_t)&local_618,msg_05);
              local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffffffffff00;
              local_3e8._0_8_ = &PTR__lazy_ostream_01139f30;
              local_3d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_3d8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
              local_628 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_620 = "";
              pTVar9 = &tx_2.hash;
              pvVar6 = (iterator)0x2;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<false>,transaction_identifier<false>>
                        (local_3e8,&local_628,0x5b,1,2,pTVar9,"tx_2.GetHash()",
                         (lazy_ostream *)&txid_2,"txid_2");
              local_638 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_630 = "";
              local_648 = &boost::unit_test::basic_cstring<char_const>::null;
              local_640 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_06.m_end = (iterator)pTVar9;
              msg_06.m_begin = pvVar6;
              file_06.m_end = (iterator)0x5c;
              file_06.m_begin = (iterator)&local_638;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                         (size_t)&local_648,msg_06);
              local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffffffffff00;
              local_3e8._0_8_ = &PTR__lazy_ostream_01139f30;
              local_3d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_3d8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
              local_658 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_650 = "";
              pTVar9 = &tx_3.hash;
              pvVar6 = (iterator)0x2;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<false>,transaction_identifier<false>>
                        (local_3e8,&local_658,0x5c,1,2,pTVar9,"tx_3.GetHash()",ar,"txid_3");
              local_668 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_660 = "";
              local_678 = &boost::unit_test::basic_cstring<char_const>::null;
              local_670 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_07.m_end = (iterator)pTVar9;
              msg_07.m_begin = pvVar6;
              file_07.m_end = (iterator)0x5e;
              file_07.m_begin = (iterator)&local_668;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                         (size_t)&local_678,msg_07);
              base_blob<256u>::GetHex_abi_cxx11_((string *)local_3e8,(base_blob<256u> *)&txid_2);
              base_blob<256u>::GetHex_abi_cxx11_
                        ((string *)&calculated_hash_123,(base_blob<256u> *)&txid_1);
              _Var2 = std::operator<=><char,std::char_traits<char>,std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_3e8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&calculated_hash_123);
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0] = (byte)_Var2._M_value >> 7;
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[8] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[9] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[10] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems._0_8_ =
                   anon_var_dwarf_124cfda;
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems._8_8_ =
                   (long)"txid_2.GetHex() < txid_1.GetHex()" + 0x21;
              hash_if_by_txid.super_base_blob<256U>.m_data._M_elems._8_8_ =
                   hash_if_by_txid.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
              hash_if_by_txid.super_base_blob<256U>.m_data._M_elems._0_8_ =
                   &PTR__lazy_ostream_0113a070;
              hash_if_by_txid.super_base_blob<256U>.m_data._M_elems._16_8_ =
                   boost::unit_test::lazy_ostream::inst;
              local_688 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_680 = "";
              pvVar6 = &DAT_00000001;
              pvVar8 = (iterator)0x0;
              hash_if_by_txid.super_base_blob<256U>.m_data._M_elems._24_8_ = &hash_if_use_int_order;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)&hash_if_use_txid,(lazy_ostream *)&hash_if_by_txid,1,0,
                         WARN,(check_type)ar,(size_t)&local_688,0x5e);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)
                         (hash_if_use_txid.super_base_blob<256U>.m_data._M_elems + 0x10));
              std::__cxx11::string::~string((string *)&calculated_hash_123);
              std::__cxx11::string::~string((string *)local_3e8);
              local_698 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_690 = "";
              local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_08.m_end = pvVar8;
              msg_08.m_begin = pvVar6;
              file_08.m_end = (iterator)0x60;
              file_08.m_begin = (iterator)&local_698;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
                         (size_t)&local_6a8,msg_08);
              bVar3 = ::operator!=((base_blob<256U> *)&txid_1,(base_blob<256U> *)&wtxid_1);
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[8] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[9] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[10] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
              hash_if_by_txid.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_124cff3;
              hash_if_by_txid.super_base_blob<256U>.m_data._M_elems._8_8_ =
                   (long)"txid_1.ToUint256() != wtxid_1.ToUint256()" + 0x29;
              local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffffffffff00;
              local_3e8._0_8_ = &PTR__lazy_ostream_0113a070;
              local_3d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_6b8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_6b0 = "";
              pvVar6 = &DAT_00000001;
              pvVar8 = (iterator)0x0;
              local_3d8._8_8_ = (lazy_ostream *)&hash_if_by_txid;
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0] = bVar3;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)&calculated_hash_123,(lazy_ostream *)local_3e8,1,0,WARN
                         ,(check_type)ar,(size_t)&local_6b8,0x60);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)
                         (calculated_hash_123.super_base_blob<256U>.m_data._M_elems + 0x10));
              local_6c8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_6c0 = "";
              local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_09.m_end = pvVar8;
              msg_09.m_begin = pvVar6;
              file_09.m_end = (iterator)0x61;
              file_09.m_begin = (iterator)&local_6c8;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,
                         (size_t)&local_6d8,msg_09);
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0] =
                   ::operator==((base_blob<256U> *)&txid_2,(base_blob<256U> *)&wtxid_2);
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[8] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[9] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[10] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
              hash_if_by_txid.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_124d00c;
              hash_if_by_txid.super_base_blob<256U>.m_data._M_elems._8_8_ =
                   (long)"txid_2.ToUint256() == wtxid_2.ToUint256()" + 0x29;
              local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffffffffff00;
              local_3e8._0_8_ = &PTR__lazy_ostream_0113a070;
              local_3d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_6e8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_6e0 = "";
              pvVar6 = &DAT_00000001;
              pvVar8 = (iterator)0x0;
              local_3d8._8_8_ = (lazy_ostream *)&hash_if_by_txid;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)&calculated_hash_123,(lazy_ostream *)local_3e8,1,0,WARN
                         ,(check_type)ar,(size_t)&local_6e8,0x61);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)
                         (calculated_hash_123.super_base_blob<256U>.m_data._M_elems + 0x10));
              local_6f8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_6f0 = "";
              local_708 = &boost::unit_test::basic_cstring<char_const>::null;
              local_700 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_10.m_end = pvVar8;
              msg_10.m_begin = pvVar6;
              file_10.m_end = (iterator)0x62;
              file_10.m_begin = (iterator)&local_6f8;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,
                         (size_t)&local_708,msg_10);
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0] =
                   ::operator!=((base_blob<256U> *)&txid_3,(base_blob<256U> *)&wtxid_3);
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[8] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[9] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[10] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
              hash_if_by_txid.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_124d017;
              hash_if_by_txid.super_base_blob<256U>.m_data._M_elems._8_8_ =
                   (long)"txid_3.ToUint256() != wtxid_3.ToUint256()" + 0x29;
              local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffffffffff00;
              local_3e8._0_8_ = &PTR__lazy_ostream_0113a070;
              local_3d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_718 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_710 = "";
              pvVar6 = &DAT_00000001;
              pvVar8 = (iterator)0x0;
              local_3d8._8_8_ = (lazy_ostream *)&hash_if_by_txid;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)&calculated_hash_123,(lazy_ostream *)local_3e8,1,0,WARN
                         ,(check_type)ar,(size_t)&local_718,0x62);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)
                         (calculated_hash_123.super_base_blob<256U>.m_data._M_elems + 0x10));
              local_728 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_720 = "";
              local_738 = &boost::unit_test::basic_cstring<char_const>::null;
              local_730 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_11.m_end = pvVar8;
              msg_11.m_begin = pvVar6;
              file_11.m_end = (iterator)0x66;
              file_11.m_begin = (iterator)&local_728;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
                         (size_t)&local_738,msg_11);
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0] =
                   transaction_identifier<true>::operator<(&wtxid_2,&wtxid_1);
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[8] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[9] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[10] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
              hash_if_by_txid.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_124d022;
              hash_if_by_txid.super_base_blob<256U>.m_data._M_elems._8_8_ =
                   (long)"wtxid_2 < wtxid_1" + 0x11;
              local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffffffffff00;
              local_3e8._0_8_ = &PTR__lazy_ostream_0113a070;
              local_3d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_748 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_740 = "";
              pvVar6 = &DAT_00000001;
              pvVar8 = (iterator)0x0;
              local_3d8._8_8_ = (lazy_ostream *)&hash_if_by_txid;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)&calculated_hash_123,(lazy_ostream *)local_3e8,1,0,WARN
                         ,(check_type)ar,(size_t)&local_748,0x66);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)
                         (calculated_hash_123.super_base_blob<256U>.m_data._M_elems + 0x10));
              local_758 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_750 = "";
              local_768 = &boost::unit_test::basic_cstring<char_const>::null;
              local_760 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_12.m_end = pvVar8;
              msg_12.m_begin = pvVar6;
              file_12.m_end = &DAT_00000068;
              file_12.m_begin = (iterator)&local_758;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,
                         (size_t)&local_768,msg_12);
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0] =
                   transaction_identifier<true>::operator<(&wtxid_2,&wtxid_3);
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[8] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[9] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[10] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
              calculated_hash_123.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
              hash_if_by_txid.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_124d03b;
              hash_if_by_txid.super_base_blob<256U>.m_data._M_elems._8_8_ =
                   (long)"wtxid_2 < wtxid_3" + 0x11;
              local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffffffffff00;
              local_3e8._0_8_ = &PTR__lazy_ostream_0113a070;
              local_3d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_778 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_770 = "";
              pvVar6 = &DAT_00000001;
              pvVar8 = (iterator)0x0;
              local_3d8._8_8_ = (lazy_ostream *)&hash_if_by_txid;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)&calculated_hash_123,(lazy_ostream *)local_3e8,1,0,WARN
                         ,(check_type)ar,(size_t)&local_778,0x68);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)
                         (calculated_hash_123.super_base_blob<256U>.m_data._M_elems + 0x10));
              std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_3e8,
                         &ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
              std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&local_3d8,
                         &ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
              std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_3c8,
                         &ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
              __l._M_len = 3;
              __l._M_array = (iterator)local_3e8;
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::vector(&package_123,__l,(allocator_type *)&calculated_hash_123);
              lVar5 = 0x28;
              do {
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3e8 + lVar5));
                lVar5 = lVar5 + -0x10;
              } while (lVar5 != -8);
              std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_3e8,
                         &ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
              std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&local_3d8,
                         &ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
              std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_3c8,
                         &ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
              __l_00._M_len = 3;
              __l_00._M_array = (iterator)local_3e8;
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::vector(&package_132,__l_00,(allocator_type *)&calculated_hash_123);
              lVar5 = 0x28;
              do {
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3e8 + lVar5));
                lVar5 = lVar5 + -0x10;
              } while (lVar5 != -8);
              std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_3e8,
                         &ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
              std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&local_3d8,
                         &ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
              std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_3c8,
                         &ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
              __l_01._M_len = 3;
              __l_01._M_array = (iterator)local_3e8;
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::vector(&package_231,__l_01,(allocator_type *)&calculated_hash_123);
              lVar5 = 0x28;
              do {
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3e8 + lVar5));
                lVar5 = lVar5 + -0x10;
              } while (lVar5 != -8);
              std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_3e8,
                         &ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
              std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&local_3d8,
                         &ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
              std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_3c8,
                         &ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
              __l_02._M_len = 3;
              __l_02._M_array = (iterator)local_3e8;
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::vector(&package_213,__l_02,(allocator_type *)&calculated_hash_123);
              lVar5 = 0x28;
              do {
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3e8 + lVar5));
                lVar5 = lVar5 + -0x10;
              } while (lVar5 != -8);
              std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_3e8,
                         &ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
              std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&local_3d8,
                         &ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
              std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_3c8,
                         &ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
              __l_03._M_len = 3;
              __l_03._M_array = (iterator)local_3e8;
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::vector(&package_312,__l_03,(allocator_type *)&calculated_hash_123);
              lVar5 = 0x28;
              do {
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3e8 + lVar5));
                lVar5 = lVar5 + -0x10;
              } while (lVar5 != -8);
              std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_3e8,
                         &ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
              std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&local_3d8,
                         &ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
              std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_3c8,
                         &ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
              __l_04._M_len = 3;
              __l_04._M_array = (iterator)local_3e8;
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::vector(&package_321,__l_04,(allocator_type *)&calculated_hash_123);
              lVar5 = 0x28;
              do {
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3e8 + lVar5));
                lVar5 = lVar5 + -0x10;
              } while (lVar5 != -8);
              local_3b8[0x20] = '\0';
              local_3b8[0x21] = '\0';
              local_3b8[0x22] = '\0';
              local_3b8[0x23] = '\0';
              local_3b8[0x24] = '\0';
              local_3b8[0x25] = '\0';
              local_3b8[0x26] = '\0';
              local_3b8[0x27] = '\0';
              local_3b8[0x28] = '\0';
              local_3b8[0x29] = '\0';
              local_3b8[0x2a] = '\0';
              local_3b8[0x2b] = '\0';
              local_3b8[0x2c] = '\0';
              local_3b8[0x2d] = '\0';
              local_3b8[0x2e] = '\0';
              local_3b8[0x2f] = '\0';
              local_3b8[0x10] = '\0';
              local_3b8[0x11] = '\0';
              local_3b8[0x12] = '\0';
              local_3b8[0x13] = '\0';
              local_3b8[0x14] = '\0';
              local_3b8[0x15] = '\0';
              local_3b8[0x16] = '\0';
              local_3b8[0x17] = '\0';
              local_3b8[0x18] = '\0';
              local_3b8[0x19] = '\0';
              local_3b8[0x1a] = '\0';
              local_3b8[0x1b] = '\0';
              local_3b8[0x1c] = '\0';
              local_3b8[0x1d] = '\0';
              local_3b8[0x1e] = '\0';
              local_3b8[0x1f] = '\0';
              local_3b8[0] = '\0';
              local_3b8[1] = '\0';
              local_3b8[2] = '\0';
              local_3b8[3] = '\0';
              local_3b8[4] = '\0';
              local_3b8[5] = '\0';
              local_3b8[6] = '\0';
              local_3b8[7] = '\0';
              local_3b8[8] = '\0';
              local_3b8[9] = '\0';
              local_3b8[10] = '\0';
              local_3b8[0xb] = '\0';
              local_3b8[0xc] = '\0';
              local_3b8[0xd] = '\0';
              local_3b8[0xe] = '\0';
              local_3b8[0xf] = '\0';
              local_3c8._M_ptr = (element_type *)0x0;
              local_3c8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_3d8._M_allocated_capacity = 0;
              local_3d8._8_8_ = 0;
              local_3e8._0_8_ = 0;
              local_3e8._8_8_ = 0;
              local_3b8[0x30] = '\0';
              local_3b8[0x31] = '\0';
              local_3b8[0x32] = '\0';
              local_3b8[0x33] = '\0';
              local_3b8[0x34] = '\0';
              local_3b8[0x35] = '\0';
              local_3b8[0x36] = '\0';
              local_3b8[0x37] = '\0';
              CSHA256::CSHA256((CSHA256 *)local_3e8);
              base_blob<256U>::Serialize<HashWriter>
                        ((base_blob<256U> *)&wtxid_1,(HashWriter *)local_3e8);
              base_blob<256U>::Serialize<HashWriter>
                        ((base_blob<256U> *)&wtxid_2,(HashWriter *)local_3e8);
              base_blob<256U>::Serialize<HashWriter>
                        ((base_blob<256U> *)&wtxid_3,(HashWriter *)local_3e8);
              HashWriter::GetSHA256(&calculated_hash_123,(HashWriter *)local_3e8);
              local_3b8[0x20] = '\0';
              local_3b8[0x21] = '\0';
              local_3b8[0x22] = '\0';
              local_3b8[0x23] = '\0';
              local_3b8[0x24] = '\0';
              local_3b8[0x25] = '\0';
              local_3b8[0x26] = '\0';
              local_3b8[0x27] = '\0';
              local_3b8[0x28] = '\0';
              local_3b8[0x29] = '\0';
              local_3b8[0x2a] = '\0';
              local_3b8[0x2b] = '\0';
              local_3b8[0x2c] = '\0';
              local_3b8[0x2d] = '\0';
              local_3b8[0x2e] = '\0';
              local_3b8[0x2f] = '\0';
              local_3b8[0x10] = '\0';
              local_3b8[0x11] = '\0';
              local_3b8[0x12] = '\0';
              local_3b8[0x13] = '\0';
              local_3b8[0x14] = '\0';
              local_3b8[0x15] = '\0';
              local_3b8[0x16] = '\0';
              local_3b8[0x17] = '\0';
              local_3b8[0x18] = '\0';
              local_3b8[0x19] = '\0';
              local_3b8[0x1a] = '\0';
              local_3b8[0x1b] = '\0';
              local_3b8[0x1c] = '\0';
              local_3b8[0x1d] = '\0';
              local_3b8[0x1e] = '\0';
              local_3b8[0x1f] = '\0';
              local_3b8[0] = '\0';
              local_3b8[1] = '\0';
              local_3b8[2] = '\0';
              local_3b8[3] = '\0';
              local_3b8[4] = '\0';
              local_3b8[5] = '\0';
              local_3b8[6] = '\0';
              local_3b8[7] = '\0';
              local_3b8[8] = '\0';
              local_3b8[9] = '\0';
              local_3b8[10] = '\0';
              local_3b8[0xb] = '\0';
              local_3b8[0xc] = '\0';
              local_3b8[0xd] = '\0';
              local_3b8[0xe] = '\0';
              local_3b8[0xf] = '\0';
              local_3c8._M_ptr = (element_type *)0x0;
              local_3c8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_3d8._M_allocated_capacity = 0;
              local_3d8._8_8_ = 0;
              local_3e8._0_8_ = 0;
              local_3e8._8_8_ = 0;
              local_3b8[0x30] = '\0';
              local_3b8[0x31] = '\0';
              local_3b8[0x32] = '\0';
              local_3b8[0x33] = '\0';
              local_3b8[0x34] = '\0';
              local_3b8[0x35] = '\0';
              local_3b8[0x36] = '\0';
              local_3b8[0x37] = '\0';
              CSHA256::CSHA256((CSHA256 *)local_3e8);
              base_blob<256U>::Serialize<HashWriter>
                        ((base_blob<256U> *)&wtxid_2,(HashWriter *)local_3e8);
              base_blob<256U>::Serialize<HashWriter>
                        ((base_blob<256U> *)&wtxid_1,(HashWriter *)local_3e8);
              base_blob<256U>::Serialize<HashWriter>
                        ((base_blob<256U> *)&wtxid_3,(HashWriter *)local_3e8);
              HashWriter::GetSHA256(&hash_if_by_txid,(HashWriter *)local_3e8);
              local_818 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_810 = "";
              local_828 = &boost::unit_test::basic_cstring<char_const>::null;
              local_820 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_13.m_end = pvVar8;
              msg_13.m_begin = pvVar6;
              file_13.m_end = (iterator)0x75;
              file_13.m_begin = (iterator)&local_818;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,
                         (size_t)&local_828,msg_13);
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0] =
                   ::operator!=(&hash_if_by_txid.super_base_blob<256U>,
                                &calculated_hash_123.super_base_blob<256U>);
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[8] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[9] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[10] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
              hash_if_use_txid.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems._0_8_ =
                   anon_var_dwarf_124d046;
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems._8_8_ =
                   (long)"hash_if_by_txid != calculated_hash_123" + 0x26;
              local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffffffffff00;
              local_3e8._0_8_ = &PTR__lazy_ostream_0113a070;
              local_3d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_838 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_830 = "";
              pvVar6 = &DAT_00000001;
              pvVar8 = (iterator)0x0;
              local_3d8._8_8_ = &hash_if_use_int_order;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)&hash_if_use_txid,(lazy_ostream *)local_3e8,1,0,WARN,
                         (check_type)ar,(size_t)&local_838,0x75);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)
                         (hash_if_use_txid.super_base_blob<256U>.m_data._M_elems + 0x10));
              local_3b8[0x20] = '\0';
              local_3b8[0x21] = '\0';
              local_3b8[0x22] = '\0';
              local_3b8[0x23] = '\0';
              local_3b8[0x24] = '\0';
              local_3b8[0x25] = '\0';
              local_3b8[0x26] = '\0';
              local_3b8[0x27] = '\0';
              local_3b8[0x28] = '\0';
              local_3b8[0x29] = '\0';
              local_3b8[0x2a] = '\0';
              local_3b8[0x2b] = '\0';
              local_3b8[0x2c] = '\0';
              local_3b8[0x2d] = '\0';
              local_3b8[0x2e] = '\0';
              local_3b8[0x2f] = '\0';
              local_3b8[0x10] = '\0';
              local_3b8[0x11] = '\0';
              local_3b8[0x12] = '\0';
              local_3b8[0x13] = '\0';
              local_3b8[0x14] = '\0';
              local_3b8[0x15] = '\0';
              local_3b8[0x16] = '\0';
              local_3b8[0x17] = '\0';
              local_3b8[0x18] = '\0';
              local_3b8[0x19] = '\0';
              local_3b8[0x1a] = '\0';
              local_3b8[0x1b] = '\0';
              local_3b8[0x1c] = '\0';
              local_3b8[0x1d] = '\0';
              local_3b8[0x1e] = '\0';
              local_3b8[0x1f] = '\0';
              local_3b8[0] = '\0';
              local_3b8[1] = '\0';
              local_3b8[2] = '\0';
              local_3b8[3] = '\0';
              local_3b8[4] = '\0';
              local_3b8[5] = '\0';
              local_3b8[6] = '\0';
              local_3b8[7] = '\0';
              local_3b8[8] = '\0';
              local_3b8[9] = '\0';
              local_3b8[10] = '\0';
              local_3b8[0xb] = '\0';
              local_3b8[0xc] = '\0';
              local_3b8[0xd] = '\0';
              local_3b8[0xe] = '\0';
              local_3b8[0xf] = '\0';
              local_3c8._M_ptr = (element_type *)0x0;
              local_3c8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_3d8._M_allocated_capacity = 0;
              local_3d8._8_8_ = 0;
              local_3e8._0_8_ = 0;
              local_3e8._8_8_ = 0;
              local_3b8[0x30] = '\0';
              local_3b8[0x31] = '\0';
              local_3b8[0x32] = '\0';
              local_3b8[0x33] = '\0';
              local_3b8[0x34] = '\0';
              local_3b8[0x35] = '\0';
              local_3b8[0x36] = '\0';
              local_3b8[0x37] = '\0';
              CSHA256::CSHA256((CSHA256 *)local_3e8);
              base_blob<256U>::Serialize<HashWriter>
                        ((base_blob<256U> *)&txid_2,(HashWriter *)local_3e8);
              base_blob<256U>::Serialize<HashWriter>
                        ((base_blob<256U> *)&txid_1,(HashWriter *)local_3e8);
              base_blob<256U>::Serialize<HashWriter>
                        ((base_blob<256U> *)&txid_3,(HashWriter *)local_3e8);
              HashWriter::GetSHA256(&hash_if_use_txid,(HashWriter *)local_3e8);
              local_848 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_840 = "";
              local_858 = &boost::unit_test::basic_cstring<char_const>::null;
              local_850 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_14.m_end = pvVar8;
              msg_14.m_begin = pvVar6;
              file_14.m_end = (iterator)0x78;
              file_14.m_begin = (iterator)&local_848;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,
                         (size_t)&local_858,msg_14);
              bVar3 = ::operator!=(&hash_if_use_txid.super_base_blob<256U>,
                                   &calculated_hash_123.super_base_blob<256U>);
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0] = bVar3;
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[8] = '\0';
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[9] = '\0';
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[10] = '\0';
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
              hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
              local_3d8._8_8_ = local_448;
              local_448 = (undefined1  [8])0xc621d2;
              local_440 = (element_type *)0xc621f9;
              local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffffffffff00;
              local_3e8._0_8_ = &PTR__lazy_ostream_0113a070;
              local_3d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_868 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_860 = "";
              pvVar6 = &DAT_00000001;
              pvVar8 = (iterator)0x0;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)&hash_if_use_int_order,(lazy_ostream *)local_3e8,1,0,
                         WARN,(check_type)ar,(size_t)&local_868,0x78);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)
                         (hash_if_use_int_order.super_base_blob<256U>.m_data._M_elems + 0x10));
              local_3b8[0x20] = '\0';
              local_3b8[0x21] = '\0';
              local_3b8[0x22] = '\0';
              local_3b8[0x23] = '\0';
              local_3b8[0x24] = '\0';
              local_3b8[0x25] = '\0';
              local_3b8[0x26] = '\0';
              local_3b8[0x27] = '\0';
              local_3b8[0x28] = '\0';
              local_3b8[0x29] = '\0';
              local_3b8[0x2a] = '\0';
              local_3b8[0x2b] = '\0';
              local_3b8[0x2c] = '\0';
              local_3b8[0x2d] = '\0';
              local_3b8[0x2e] = '\0';
              local_3b8[0x2f] = '\0';
              local_3b8[0x10] = '\0';
              local_3b8[0x11] = '\0';
              local_3b8[0x12] = '\0';
              local_3b8[0x13] = '\0';
              local_3b8[0x14] = '\0';
              local_3b8[0x15] = '\0';
              local_3b8[0x16] = '\0';
              local_3b8[0x17] = '\0';
              local_3b8[0x18] = '\0';
              local_3b8[0x19] = '\0';
              local_3b8[0x1a] = '\0';
              local_3b8[0x1b] = '\0';
              local_3b8[0x1c] = '\0';
              local_3b8[0x1d] = '\0';
              local_3b8[0x1e] = '\0';
              local_3b8[0x1f] = '\0';
              local_3b8[0] = '\0';
              local_3b8[1] = '\0';
              local_3b8[2] = '\0';
              local_3b8[3] = '\0';
              local_3b8[4] = '\0';
              local_3b8[5] = '\0';
              local_3b8[6] = '\0';
              local_3b8[7] = '\0';
              local_3b8[8] = '\0';
              local_3b8[9] = '\0';
              local_3b8[10] = '\0';
              local_3b8[0xb] = '\0';
              local_3b8[0xc] = '\0';
              local_3b8[0xd] = '\0';
              local_3b8[0xe] = '\0';
              local_3b8[0xf] = '\0';
              local_3c8._M_ptr = (element_type *)0x0;
              local_3c8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_3d8._M_allocated_capacity = 0;
              local_3d8._8_8_ = 0;
              local_3e8._0_8_ = 0;
              local_3e8._8_8_ = 0;
              local_3b8[0x30] = '\0';
              local_3b8[0x31] = '\0';
              local_3b8[0x32] = '\0';
              local_3b8[0x33] = '\0';
              local_3b8[0x34] = '\0';
              local_3b8[0x35] = '\0';
              local_3b8[0x36] = '\0';
              local_3b8[0x37] = '\0';
              CSHA256::CSHA256((CSHA256 *)local_3e8);
              base_blob<256U>::Serialize<HashWriter>
                        ((base_blob<256U> *)&wtxid_2,(HashWriter *)local_3e8);
              base_blob<256U>::Serialize<HashWriter>
                        ((base_blob<256U> *)&wtxid_1,(HashWriter *)local_3e8);
              base_blob<256U>::Serialize<HashWriter>
                        ((base_blob<256U> *)&wtxid_3,(HashWriter *)local_3e8);
              HashWriter::GetSHA256(&hash_if_use_int_order,(HashWriter *)local_3e8);
              local_878 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_870 = "";
              local_888 = &boost::unit_test::basic_cstring<char_const>::null;
              local_880 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_15.m_end = pvVar8;
              msg_15.m_begin = pvVar6;
              file_15.m_end = (iterator)0x7b;
              file_15.m_begin = (iterator)&local_878;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,
                         (size_t)&local_888,msg_15);
              rVar4.super_readonly_property<bool>.super_class_property<bool>.value =
                   (readonly_property<bool>)
                   ::operator!=(&hash_if_use_int_order.super_base_blob<256U>,
                                &calculated_hash_123.super_base_blob<256U>);
              local_448[0] = rVar4.super_readonly_property<bool>.super_class_property<bool>.value;
              local_440 = (element_type *)0x0;
              asStack_438[0].pi_ = (sp_counted_base *)0x0;
              local_3d8._8_8_ = &local_898;
              local_898 = "hash_if_use_int_order != calculated_hash_123";
              local_890 = "";
              local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffffffffff00;
              local_3e8._0_8_ = &PTR__lazy_ostream_0113a070;
              local_3d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_8a8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_8a0 = "";
              pvVar6 = &DAT_00000001;
              pvVar8 = (iterator)0x0;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_448,(lazy_ostream *)local_3e8,1,0,WARN,
                         (check_type)ar,(size_t)&local_8a8,0x7b);
              boost::detail::shared_count::~shared_count(asStack_438);
              local_8b8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_8b0 = "";
              local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_16.m_end = pvVar8;
              msg_16.m_begin = pvVar6;
              file_16.m_end = (iterator)0x7d;
              file_16.m_begin = (iterator)&local_8b8;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
                         (size_t)&local_8c8,msg_16);
              local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffffffffff00;
              local_3e8._0_8_ = &PTR__lazy_ostream_01139f30;
              local_3d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_3d8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
              local_8d8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_8d0 = "";
              GetPackageHash((uint256 *)local_448,&package_123);
              pvVar6 = (iterator)0x2;
              puVar10 = &calculated_hash_123;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                        (local_3e8,&local_8d8,0x7d,1,2,puVar10,"calculated_hash_123",
                         (uint256 *)local_448,"GetPackageHash(package_123)");
              local_8e8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_8e0 = "";
              local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_17.m_end = (iterator)puVar10;
              msg_17.m_begin = pvVar6;
              file_17.m_end = (iterator)0x7e;
              file_17.m_begin = (iterator)&local_8e8;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,
                         (size_t)&local_8f8,msg_17);
              local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffffffffff00;
              local_3e8._0_8_ = &PTR__lazy_ostream_01139f30;
              local_3d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_3d8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
              local_908 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_900 = "";
              GetPackageHash((uint256 *)local_448,&package_132);
              pvVar6 = (iterator)0x2;
              puVar10 = &calculated_hash_123;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                        (local_3e8,&local_908,0x7e,1,2,puVar10,"calculated_hash_123",
                         (uint256 *)local_448,"GetPackageHash(package_132)");
              local_918 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_910 = "";
              local_928 = &boost::unit_test::basic_cstring<char_const>::null;
              local_920 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_18.m_end = (iterator)puVar10;
              msg_18.m_begin = pvVar6;
              file_18.m_end = (iterator)0x7f;
              file_18.m_begin = (iterator)&local_918;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,
                         (size_t)&local_928,msg_18);
              local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffffffffff00;
              local_3e8._0_8_ = &PTR__lazy_ostream_01139f30;
              local_3d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_3d8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
              local_938 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_930 = "";
              GetPackageHash((uint256 *)local_448,&package_231);
              pvVar6 = (iterator)0x2;
              puVar10 = &calculated_hash_123;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                        (local_3e8,&local_938,0x7f,1,2,puVar10,"calculated_hash_123",
                         (uint256 *)local_448,"GetPackageHash(package_231)");
              local_948 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_940 = "";
              local_958 = &boost::unit_test::basic_cstring<char_const>::null;
              local_950 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_19.m_end = (iterator)puVar10;
              msg_19.m_begin = pvVar6;
              file_19.m_end = (iterator)0x80;
              file_19.m_begin = (iterator)&local_948;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,
                         (size_t)&local_958,msg_19);
              local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffffffffff00;
              local_3e8._0_8_ = &PTR__lazy_ostream_01139f30;
              local_3d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_3d8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
              local_968 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_960 = "";
              GetPackageHash((uint256 *)local_448,&package_213);
              pvVar6 = (iterator)0x2;
              puVar10 = &calculated_hash_123;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                        (local_3e8,&local_968,0x80,1,2,puVar10,"calculated_hash_123",
                         (uint256 *)local_448,"GetPackageHash(package_213)");
              local_978 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_970 = "";
              local_988 = &boost::unit_test::basic_cstring<char_const>::null;
              local_980 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_20.m_end = (iterator)puVar10;
              msg_20.m_begin = pvVar6;
              file_20.m_end = (iterator)0x81;
              file_20.m_begin = (iterator)&local_978;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,
                         (size_t)&local_988,msg_20);
              local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffffffffff00;
              local_3e8._0_8_ = &PTR__lazy_ostream_01139f30;
              local_3d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_3d8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
              local_998 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_990 = "";
              GetPackageHash((uint256 *)local_448,&package_312);
              pvVar6 = (iterator)0x2;
              puVar10 = &calculated_hash_123;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                        (local_3e8,&local_998,0x81,1,2,puVar10,"calculated_hash_123",
                         (uint256 *)local_448,"GetPackageHash(package_312)");
              local_9a8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_9a0 = "";
              local_9b8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_21.m_end = (iterator)puVar10;
              msg_21.m_begin = pvVar6;
              file_21.m_end = (iterator)0x82;
              file_21.m_begin = (iterator)&local_9a8;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,
                         (size_t)&local_9b8,msg_21);
              local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffffffffff00;
              local_3e8._0_8_ = &PTR__lazy_ostream_01139f30;
              local_3d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_3d8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
              local_9c8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
              ;
              local_9c0 = "";
              GetPackageHash((uint256 *)local_448,&package_321);
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                        (local_3e8,&local_9c8,0x82,1,2,&calculated_hash_123,"calculated_hash_123",
                         (uint256 *)local_448,"GetPackageHash(package_321)");
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::~vector(&package_321);
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::~vector(&package_312);
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::~vector(&package_213);
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::~vector(&package_231);
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::~vector(&package_132);
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::~vector(&package_123);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&ptx_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              CTransaction::~CTransaction(&tx_3);
              std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                        ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream_3
                        );
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&ptx_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              CTransaction::~CTransaction(&tx_2);
              std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                        ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream_2
                        );
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&ptx_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              CTransaction::~CTransaction(&tx_1);
              std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                        ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream_1
                        );
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                return;
              }
            }
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(package_hash_tests)
{
    // Random real segwit transaction
    DataStream stream_1{
        "02000000000101964b8aa63509579ca6086e6012eeaa4c2f4dd1e283da29b67c8eea38b3c6fd220000000000fdffffff0294c618000000000017a9145afbbb42f4e83312666d0697f9e66259912ecde38768fa2c0000000000160014897388a0889390fd0e153a22bb2cf9d8f019faf50247304402200547406380719f84d68cf4e96cc3e4a1688309ef475b150be2b471c70ea562aa02206d255f5acc40fd95981874d77201d2eb07883657ce1c796513f32b6079545cdf0121023ae77335cefcb5ab4c1dc1fb0d2acfece184e593727d7d5906c78e564c7c11d125cf0c00"_hex,
    };
    CTransaction tx_1(deserialize, TX_WITH_WITNESS, stream_1);
    CTransactionRef ptx_1{MakeTransactionRef(tx_1)};

    // Random real nonsegwit transaction
    DataStream stream_2{
        "01000000010b26e9b7735eb6aabdf358bab62f9816a21ba9ebdb719d5299e88607d722c190000000008b4830450220070aca44506c5cef3a16ed519d7c3c39f8aab192c4e1c90d065f37b8a4af6141022100a8e160b856c2d43d27d8fba71e5aef6405b8643ac4cb7cb3c462aced7f14711a0141046d11fee51b0e60666d5049a9101a72741df480b96ee26488a4d3466b95c9a40ac5eeef87e10a5cd336c19a84565f80fa6c547957b7700ff4dfbdefe76036c339ffffffff021bff3d11000000001976a91404943fdd508053c75000106d3bc6e2754dbcff1988ac2f15de00000000001976a914a266436d2965547608b9e15d9032a7b9d64fa43188ac00000000"_hex,
    };
    CTransaction tx_2(deserialize, TX_WITH_WITNESS, stream_2);
    CTransactionRef ptx_2{MakeTransactionRef(tx_2)};

    // Random real segwit transaction
    DataStream stream_3{
        "0200000000010177862801f77c2c068a70372b4c435ef8dd621291c36a64eb4dd491f02218f5324600000000fdffffff014a0100000000000022512035ea312034cfac01e956a269f3bf147f569c2fbb00180677421262da042290d803402be713325ff285e66b0380f53f2fae0d0fb4e16f378a440fed51ce835061437566729d4883bc917632f3cff474d6384bc8b989961a1d730d4a87ed38ad28bd337b20f1d658c6c138b1c312e072b4446f50f01ae0da03a42e6274f8788aae53416a7fac0063036f7264010118746578742f706c61696e3b636861727365743d7574662d3800357b2270223a226272632d3230222c226f70223a226d696e74222c227469636b223a224342414c222c22616d74223a2236393639227d6821c1f1d658c6c138b1c312e072b4446f50f01ae0da03a42e6274f8788aae53416a7f00000000"_hex,
    };
    CTransaction tx_3(deserialize, TX_WITH_WITNESS, stream_3);
    CTransactionRef ptx_3{MakeTransactionRef(tx_3)};

    // It's easy to see that wtxids are sorted in lexicographical order:
    Wtxid wtxid_1{Wtxid::FromHex("85cd1a31eb38f74ed5742ec9cb546712ab5aaf747de28a9168b53e846cbda17f").value()};
    Wtxid wtxid_2{Wtxid::FromHex("b4749f017444b051c44dfd2720e88f314ff94f3dd6d56d40ef65854fcd7fff6b").value()};
    Wtxid wtxid_3{Wtxid::FromHex("e065bac15f62bb4e761d761db928ddee65a47296b2b776785abb912cdec474e3").value()};
    BOOST_CHECK_EQUAL(tx_1.GetWitnessHash(), wtxid_1);
    BOOST_CHECK_EQUAL(tx_2.GetWitnessHash(), wtxid_2);
    BOOST_CHECK_EQUAL(tx_3.GetWitnessHash(), wtxid_3);

    BOOST_CHECK(wtxid_1.GetHex() < wtxid_2.GetHex());
    BOOST_CHECK(wtxid_2.GetHex() < wtxid_3.GetHex());

    // The txids are not (we want to test that sorting and hashing use wtxid, not txid):
    Txid txid_1{Txid::FromHex("bd0f71c1d5e50589063e134fad22053cdae5ab2320db5bf5e540198b0b5a4e69").value()};
    Txid txid_2{Txid::FromHex("b4749f017444b051c44dfd2720e88f314ff94f3dd6d56d40ef65854fcd7fff6b").value()};
    Txid txid_3{Txid::FromHex("ee707be5201160e32c4fc715bec227d1aeea5940fb4295605e7373edce3b1a93").value()};
    BOOST_CHECK_EQUAL(tx_1.GetHash(), txid_1);
    BOOST_CHECK_EQUAL(tx_2.GetHash(), txid_2);
    BOOST_CHECK_EQUAL(tx_3.GetHash(), txid_3);

    BOOST_CHECK(txid_2.GetHex() < txid_1.GetHex());

    BOOST_CHECK(txid_1.ToUint256() != wtxid_1.ToUint256());
    BOOST_CHECK(txid_2.ToUint256() == wtxid_2.ToUint256());
    BOOST_CHECK(txid_3.ToUint256() != wtxid_3.ToUint256());

    // We are testing that both functions compare using GetHex() and not uint256.
    // (in this pair of wtxids, hex string order != uint256 order)
    BOOST_CHECK(wtxid_2 < wtxid_1);
    // (in this pair of wtxids, hex string order == uint256 order)
    BOOST_CHECK(wtxid_2 < wtxid_3);

    // All permutations of the package containing ptx_1, ptx_2, ptx_3 have the same package hash
    std::vector<CTransactionRef> package_123{ptx_1, ptx_2, ptx_3};
    std::vector<CTransactionRef> package_132{ptx_1, ptx_3, ptx_2};
    std::vector<CTransactionRef> package_231{ptx_2, ptx_3, ptx_1};
    std::vector<CTransactionRef> package_213{ptx_2, ptx_1, ptx_3};
    std::vector<CTransactionRef> package_312{ptx_3, ptx_1, ptx_2};
    std::vector<CTransactionRef> package_321{ptx_3, ptx_2, ptx_1};

    uint256 calculated_hash_123 = (HashWriter() << wtxid_1 << wtxid_2 << wtxid_3).GetSHA256();

    uint256 hash_if_by_txid = (HashWriter() << wtxid_2 << wtxid_1 << wtxid_3).GetSHA256();
    BOOST_CHECK(hash_if_by_txid != calculated_hash_123);

    uint256 hash_if_use_txid = (HashWriter() << txid_2 << txid_1 << txid_3).GetSHA256();
    BOOST_CHECK(hash_if_use_txid != calculated_hash_123);

    uint256 hash_if_use_int_order = (HashWriter() << wtxid_2 << wtxid_1 << wtxid_3).GetSHA256();
    BOOST_CHECK(hash_if_use_int_order != calculated_hash_123);

    BOOST_CHECK_EQUAL(calculated_hash_123, GetPackageHash(package_123));
    BOOST_CHECK_EQUAL(calculated_hash_123, GetPackageHash(package_132));
    BOOST_CHECK_EQUAL(calculated_hash_123, GetPackageHash(package_231));
    BOOST_CHECK_EQUAL(calculated_hash_123, GetPackageHash(package_213));
    BOOST_CHECK_EQUAL(calculated_hash_123, GetPackageHash(package_312));
    BOOST_CHECK_EQUAL(calculated_hash_123, GetPackageHash(package_321));
}